

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

Molecule_p __thiscall indigox::Bond::GetMolecule(Bond *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  weak_ptr<indigox::Molecule> *in_RSI;
  element_type *in_RDI;
  shared_ptr<indigox::Molecule> sVar3;
  Molecule_p MVar4;
  
  bVar1 = std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)0x10e19d);
  if (bVar1) {
    std::shared_ptr<indigox::Molecule>::shared_ptr((shared_ptr<indigox::Molecule> *)0x10e1be);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = std::weak_ptr<indigox::Molecule>::lock(in_RSI);
    _Var2 = sVar3.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  }
  MVar4.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  MVar4.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Molecule_p)MVar4.super___shared_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Molecule_p Bond::GetMolecule() const {
    if (!mol_.expired()) return mol_.lock();
    else return Molecule_p();
  }